

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

bool __thiscall
crnlib::symbol_codec::decode_receive_static_huffman_data_model
          (symbol_codec *this,static_huffman_data_model *model,
          static_huffman_data_model *pDeltaModel)

{
  vector<unsigned_char> *this_00;
  uchar uVar1;
  bool bVar2;
  bool bVar3;
  uint min_new_capacity;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  static_huffman_data_model dm;
  static_huffman_data_model local_68;
  
  min_new_capacity = get_bits(this,0xe);
  if (min_new_capacity == 0) {
    static_huffman_data_model::clear(model);
    bVar3 = true;
  }
  else {
    this_00 = &model->m_code_sizes;
    uVar4 = (model->m_code_sizes).m_size;
    if (uVar4 != min_new_capacity) {
      if (uVar4 <= min_new_capacity) {
        if ((model->m_code_sizes).m_capacity < min_new_capacity) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)this_00,min_new_capacity,uVar4 + 1 == min_new_capacity,1,
                     (object_mover)0x0,false);
          uVar4 = (model->m_code_sizes).m_size;
        }
        memset(this_00->m_p + uVar4,0,(ulong)(min_new_capacity - uVar4));
      }
      (model->m_code_sizes).m_size = min_new_capacity;
    }
    bVar3 = false;
    memset(this_00->m_p,0,(ulong)min_new_capacity);
    uVar5 = get_bits(this,5);
    if (0xffffffea < uVar5 - 0x16) {
      local_68.m_total_syms = 0;
      local_68.m_codes.m_p = (unsigned_short *)0x0;
      local_68.m_codes.m_size = 0;
      local_68.m_codes.m_capacity = 0;
      local_68.m_code_sizes.m_p = (uchar *)0x0;
      local_68.m_code_sizes.m_size = 0;
      local_68.m_code_sizes.m_capacity = 0;
      local_68.m_pDecode_tables._0_1_ = 0;
      local_68._41_8_ = 0;
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_68.m_code_sizes,0x15,false,1,(object_mover)0x0,false);
      uVar8 = 0;
      memset(local_68.m_code_sizes.m_p + local_68.m_code_sizes.m_size,0,
             (ulong)(0x15 - local_68.m_code_sizes.m_size));
      local_68.m_code_sizes.m_size = 0x15;
      do {
        uVar6 = get_bits(this,3);
        local_68.m_code_sizes.m_p[(byte)(&g_most_probable_codelength_codes)[uVar8]] = (uchar)uVar6;
        uVar8 = uVar8 + 1;
      } while (uVar5 != uVar8);
      bVar2 = static_huffman_data_model::prepare_decoder_tables(&local_68);
      uVar8 = 0;
      bVar3 = false;
      if (bVar2) {
        do {
          uVar5 = decode(this,&local_68);
          uVar4 = (uint)uVar8;
          if (uVar5 < 0x11) {
            this_00->m_p[uVar8] = (uchar)uVar5;
            uVar8 = (ulong)(uVar4 + 1);
          }
          else {
            uVar9 = min_new_capacity - uVar4;
            if (uVar5 == 0x12) {
              uVar5 = get_bits(this,7);
              if (uVar9 < uVar5 + 0xb) goto LAB_0019bf9e;
              uVar8 = (ulong)(uVar4 + uVar5 + 0xb);
            }
            else if (uVar5 == 0x11) {
              uVar5 = get_bits(this,3);
              if (uVar9 < uVar5 + 3) goto LAB_0019bf9e;
              uVar8 = (ulong)(uVar4 + uVar5 + 3);
            }
            else {
              if (1 < uVar5 - 0x13) goto LAB_0019bf9e;
              if (uVar5 == 0x13) {
                uVar5 = get_bits(this,2);
                uVar7 = uVar5 + 3;
              }
              else {
                uVar5 = get_bits(this,6);
                uVar7 = uVar5 + 7;
              }
              bVar3 = false;
              if ((uVar4 == 0) || (uVar9 < uVar7)) goto LAB_0019bfa1;
              uVar1 = this_00->m_p[uVar4 - 1];
              if (uVar1 == '\0') goto LAB_0019bf9e;
              uVar7 = uVar7 + uVar4;
              if (uVar4 < uVar7) {
                do {
                  this_00->m_p[uVar8] = uVar1;
                  uVar8 = uVar8 + 1;
                } while (uVar7 != uVar8);
                uVar8 = (ulong)uVar7;
              }
            }
          }
        } while ((uint)uVar8 < min_new_capacity);
        if ((uint)uVar8 == min_new_capacity) {
          if (((pDeltaModel != (static_huffman_data_model *)0x0) && (pDeltaModel->m_total_syms != 0)
              ) && (uVar4 = (pDeltaModel->m_code_sizes).m_size, uVar4 != 0)) {
            if (uVar4 < min_new_capacity) {
              min_new_capacity = uVar4;
            }
            uVar8 = 0;
            do {
              uVar9 = (uint)(pDeltaModel->m_code_sizes).m_p[uVar8] + (uint)this_00->m_p[uVar8];
              uVar4 = uVar9 - 0x11 & 0xff;
              if (uVar9 < 0x11) {
                uVar4 = uVar9;
              }
              this_00->m_p[uVar8] = (uchar)uVar4;
              uVar8 = uVar8 + 1;
            } while (min_new_capacity + (min_new_capacity == 0) != uVar8);
          }
          bVar3 = static_huffman_data_model::prepare_decoder_tables(model);
        }
        else {
LAB_0019bf9e:
          bVar3 = false;
        }
      }
LAB_0019bfa1:
      static_huffman_data_model::~static_huffman_data_model(&local_68);
    }
  }
  return bVar3;
}

Assistant:

bool symbol_codec::decode_receive_static_huffman_data_model(static_huffman_data_model& model, static_huffman_data_model* pDeltaModel)
    {
        CRNLIB_ASSERT(m_mode == cDecoding);

        const uint total_used_syms = decode_bits(math::total_bits(prefix_coding::cMaxSupportedSyms));
        if (!total_used_syms)
        {
            model.clear();
            return true;
        }

        model.m_code_sizes.resize(total_used_syms);
        memset(&model.m_code_sizes[0], 0, sizeof(model.m_code_sizes[0]) * total_used_syms);

        const uint num_codelength_codes_to_send = decode_bits(5);
        if ((num_codelength_codes_to_send < 1) || (num_codelength_codes_to_send > cMaxCodelengthCodes))
        {
            return false;
        }

        static_huffman_data_model dm;
        dm.m_code_sizes.resize(cMaxCodelengthCodes);

        for (uint i = 0; i < num_codelength_codes_to_send; i++)
        {
            dm.m_code_sizes[g_most_probable_codelength_codes[i]] = static_cast<uint8>(decode_bits(3));
        }

        if (!dm.prepare_decoder_tables())
        {
            return false;
        }

        uint ofs = 0;
        while (ofs < total_used_syms)
        {
            const uint num_remaining = total_used_syms - ofs;

            uint code = decode(dm);
            if (code <= 16)
            {
                model.m_code_sizes[ofs++] = static_cast<uint8>(code);
            }
            else if (code == cSmallZeroRunCode)
            {
                uint len = decode_bits(cSmallZeroRunExtraBits) + cMinSmallZeroRunSize;
                if (len > num_remaining)
                {
                    return false;
                }
                ofs += len;
            }
            else if (code == cLargeZeroRunCode)
            {
                uint len = decode_bits(cLargeZeroRunExtraBits) + cMinLargeZeroRunSize;
                if (len > num_remaining)
                {
                    return false;
                }
                ofs += len;
            }
            else if ((code == cSmallRepeatCode) || (code == cLargeRepeatCode))
            {
                uint len;
                if (code == cSmallRepeatCode)
                {
                    len = decode_bits(cSmallNonZeroRunExtraBits) + cSmallMinNonZeroRunSize;
                }
                else
                {
                    len = decode_bits(cLargeNonZeroRunExtraBits) + cLargeMinNonZeroRunSize;
                }

                if ((!ofs) || (len > num_remaining))
                {
                    return false;
                }
                const uint prev = model.m_code_sizes[ofs - 1];
                if (!prev)
                {
                    return false;
                }
                const uint end = ofs + len;
                while (ofs < end)
                {
                    model.m_code_sizes[ofs++] = static_cast<uint8>(prev);
                }
            }
            else
            {
                CRNLIB_ASSERT(0);
                return false;
            }
        }

        if (ofs != total_used_syms)
        {
            return false;
        }

        if ((pDeltaModel) && (pDeltaModel->get_total_syms()))
        {
            uint n = math::minimum(pDeltaModel->m_code_sizes.size(), total_used_syms);
            for (uint i = 0; i < n; i++)
            {
                int codesize = model.m_code_sizes[i] + pDeltaModel->m_code_sizes[i];
                if (codesize > 16)
                {
                    codesize -= 17;
                }
                model.m_code_sizes[i] = static_cast<uint8>(codesize);
            }
        }

        return model.prepare_decoder_tables();
    }